

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemExpandBlob(Mem *pMem)

{
  int iVar1;
  int local_1c;
  int nByte;
  Mem *pMem_local;
  
  local_1c = pMem->n + (pMem->u).nZero;
  if (local_1c < 1) {
    if ((pMem->flags & 0x10) == 0) {
      return 0;
    }
    local_1c = 1;
  }
  iVar1 = sqlite3VdbeMemGrow(pMem,local_1c,1);
  if (iVar1 == 0) {
    memset(pMem->z + pMem->n,0,(long)(pMem->u).nZero);
    pMem->n = (pMem->u).nZero + pMem->n;
    pMem->flags = pMem->flags & 0xbdff;
    pMem_local._4_4_ = 0;
  }
  else {
    pMem_local._4_4_ = 7;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemExpandBlob(Mem *pMem){
  int nByte;
  assert( pMem->flags & MEM_Zero );
  assert( (pMem->flags&MEM_Blob)!=0 || MemNullNochng(pMem) );
  testcase( sqlite3_value_nochange(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );

  /* Set nByte to the number of bytes required to store the expanded blob. */
  nByte = pMem->n + pMem->u.nZero;
  if( nByte<=0 ){
    if( (pMem->flags & MEM_Blob)==0 ) return SQLITE_OK;
    nByte = 1;
  }
  if( sqlite3VdbeMemGrow(pMem, nByte, 1) ){
    return SQLITE_NOMEM_BKPT;
  }

  memset(&pMem->z[pMem->n], 0, pMem->u.nZero);
  pMem->n += pMem->u.nZero;
  pMem->flags &= ~(MEM_Zero|MEM_Term);
  return SQLITE_OK;
}